

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_relative_location_path
          (xpath_parser *this,xpath_ast_node *set)

{
  lexeme_t lVar1;
  xpath_ast_node *pxVar2;
  ulong uVar3;
  undefined8 in_RSI;
  xpath_parser *in_RDI;
  bool bVar4;
  lexeme_t l;
  size_t old_depth;
  xpath_ast_node *n;
  undefined4 in_stack_ffffffffffffffd0;
  size_t sVar5;
  xpath_parser *this_00;
  
  this_00 = in_RDI;
  pxVar2 = parse_step(this,set);
  if (pxVar2 != (xpath_ast_node *)0x0) {
    sVar5 = in_RDI->_depth;
    do {
      lVar1 = xpath_lexer::current(&in_RDI->_lexer);
      bVar4 = true;
      if (lVar1 != lex_slash) {
        lVar1 = xpath_lexer::current(&in_RDI->_lexer);
        bVar4 = lVar1 == lex_double_slash;
      }
      if (!bVar4) {
        in_RDI->_depth = sVar5;
        return pxVar2;
      }
      lVar1 = xpath_lexer::current(&in_RDI->_lexer);
      xpath_lexer::next(&in_RDI->_lexer);
      if (lVar1 == lex_double_slash) {
        pxVar2 = alloc_node(this_00,(ast_type_t)((ulong)in_RSI >> 0x20),pxVar2,
                            (axis_t)(sVar5 >> 0x20),(nodetest_t)sVar5,
                            (char_t *)CONCAT44(0x11,in_stack_ffffffffffffffd0));
        if (pxVar2 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        in_RDI->_depth = in_RDI->_depth + 1;
      }
      uVar3 = in_RDI->_depth + 1;
      in_RDI->_depth = uVar3;
      if (0x400 < uVar3) {
        pxVar2 = error_rec((xpath_parser *)0x160e92);
        return pxVar2;
      }
      pxVar2 = parse_step(this,set);
    } while (pxVar2 != (xpath_ast_node *)0x0);
  }
  return (xpath_ast_node *)0x0;
}

Assistant:

xpath_ast_node* parse_relative_location_path(xpath_ast_node* set)
		{
			xpath_ast_node* n = parse_step(set);
			if (!n) return NULL;

			size_t old_depth = _depth;

			while (_lexer.current() == lex_slash || _lexer.current() == lex_double_slash)
			{
				lexeme_t l = _lexer.current();
				_lexer.next();

				if (l == lex_double_slash)
				{
					n = alloc_node(ast_step, n, axis_descendant_or_self, nodetest_type_node, NULL);
					if (!n) return NULL;

					++_depth;
				}

				if (++_depth > xpath_ast_depth_limit)
					return error_rec();

				n = parse_step(n);
				if (!n) return NULL;
			}

			_depth = old_depth;

			return n;
		}